

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  size_t sVar1;
  ImFont *pIVar2;
  bool bVar3;
  char *local_d0;
  char *p;
  ImFontConfig font_cfg;
  void *data;
  size_t data_size;
  ImWchar *glyph_ranges_local;
  ImFontConfig *font_cfg_template_local;
  char *pcStack_18;
  float size_pixels_local;
  char *filename_local;
  ImFontAtlas *this_local;
  
  data_size = (size_t)glyph_ranges;
  glyph_ranges_local = (ImWchar *)font_cfg_template;
  font_cfg_template_local._4_4_ = size_pixels;
  pcStack_18 = filename;
  filename_local = &this->Locked;
  if ((this->Locked & 1U) != 0) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_draw.cpp"
                  ,0x7af,
                  "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  data = (void *)0x0;
  font_cfg.DstFont = (ImFont *)ImFileLoadToMemory(filename,"rb",(size_t *)&data,0);
  if (font_cfg.DstFont != (ImFont *)0x0) {
    if (glyph_ranges_local == (ImWchar *)0x0) {
      ImFontConfig::ImFontConfig((ImFontConfig *)&p);
    }
    else {
      memcpy(&p,glyph_ranges_local,0x88);
    }
    local_d0 = pcStack_18;
    if (font_cfg.RasterizerFlags._2_1_ == '\0') {
      sVar1 = strlen(pcStack_18);
      local_d0 = local_d0 + sVar1;
      while( true ) {
        bVar3 = false;
        if ((pcStack_18 < local_d0) && (bVar3 = false, local_d0[-1] != '/')) {
          bVar3 = local_d0[-1] != '\\';
        }
        if (!bVar3) break;
        local_d0 = local_d0 + -1;
      }
      ImFormatString((char *)((long)&font_cfg.RasterizerFlags + 2),0x28,"%s, %.0fpx",
                     (double)font_cfg_template_local._4_4_,local_d0);
    }
    pIVar2 = AddFontFromMemoryTTF
                       (this,font_cfg.DstFont,(int)data,font_cfg_template_local._4_4_,
                        (ImFontConfig *)&p,(ImWchar *)data_size);
    return pIVar2;
  }
  __assert_fail("(0) && \"Could not load font file!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui_draw.cpp"
                ,0x7b4,
                "ImFont *ImFontAtlas::AddFontFromFileTTF(const char *, float, const ImFontConfig *, const ImWchar *)"
               );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}